

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# overdrawoptimizer.cpp
# Opt level: O3

void meshopt_optimizeOverdraw
               (uint *destination,uint *indices,size_t index_count,float *vertex_positions,
               size_t vertex_count,size_t vertex_positions_stride,float threshold)

{
  ulong uVar1;
  size_t __n;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  size_t i;
  uint *__dest;
  uint *puVar5;
  uint *puVar6;
  uint *puVar7;
  size_t sVar8;
  uint *puVar9;
  uint uVar10;
  ulong uVar11;
  size_t i_3;
  ulong uVar12;
  ulong uVar13;
  size_t sVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  char cVar24;
  bool bVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  undefined1 auVar44 [16];
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  uint histogram [2048];
  uint **local_2180;
  ulong local_2170;
  ulong local_2158;
  uint *local_2100;
  uint *local_20f8 [23];
  long local_2040;
  uint local_2038 [2050];
  
  local_2180 = &local_2100;
  memset(local_2180,0,200);
  if (vertex_count == 0 || index_count == 0) {
    local_2170 = 0;
  }
  else {
    if (destination == indices) {
      sVar8 = 0xffffffffffffffff;
      if (index_count < 0x4000000000000000) {
        sVar8 = index_count * 4;
      }
      __dest = (uint *)(*meshopt_Allocator::StorageT<void>::allocate)(sVar8);
      local_2180 = local_20f8;
      local_2040 = 1;
      local_2100 = __dest;
      memcpy(__dest,indices,index_count * 4);
      local_2170 = 1;
    }
    else {
      local_2170 = 0;
      __dest = indices;
    }
    __n = vertex_count * 4;
    sVar14 = __n;
    if (0x3fffffffffffffff < vertex_count) {
      sVar14 = 0xffffffffffffffff;
    }
    puVar5 = (uint *)(*meshopt_Allocator::StorageT<void>::allocate)(sVar14);
    local_2040 = local_2170 + 1;
    *local_2180 = puVar5;
    uVar11 = index_count / 3;
    sVar8 = 0xffffffffffffffff;
    if (index_count < 0xc000000000000000) {
      sVar8 = uVar11 * 4;
    }
    puVar6 = (uint *)(*meshopt_Allocator::StorageT<void>::allocate)(sVar8);
    local_2040 = local_2170 + 2;
    local_20f8[local_2170] = puVar6;
    local_2158 = 0;
    memset(puVar5,0,__n);
    if (2 < index_count) {
      puVar7 = __dest + 2;
      uVar10 = 0x11;
      local_2158 = 0;
      uVar19 = 0;
      do {
        uVar21 = puVar7[-1];
        uVar17 = *puVar7;
        cVar24 = 0x10 < uVar10 - puVar5[puVar7[-2]];
        if ((bool)cVar24) {
          puVar5[puVar7[-2]] = uVar10;
          uVar10 = uVar10 + 1;
        }
        if (0x10 < uVar10 - puVar5[uVar21]) {
          puVar5[uVar21] = uVar10;
          uVar10 = uVar10 + 1;
          cVar24 = cVar24 + '\x01';
        }
        if (0x10 < uVar10 - puVar5[uVar17]) {
          puVar5[uVar17] = uVar10;
          uVar10 = uVar10 + 1;
          cVar24 = cVar24 + '\x01';
        }
        if ((uVar19 == 0) || (cVar24 == '\x03')) {
          puVar6[local_2158] = (uint)uVar19;
          local_2158 = local_2158 + 1;
        }
        uVar19 = uVar19 + 1;
        puVar7 = puVar7 + 3;
      } while (uVar11 != uVar19);
    }
    sVar8 = 0xffffffffffffffff;
    if (index_count < 0xbffffffffffffffd) {
      sVar8 = uVar11 * 4 + 4;
    }
    puVar7 = (uint *)(*meshopt_Allocator::StorageT<void>::allocate)(sVar8);
    local_2040 = local_2170 + 3;
    local_20f8[local_2170 + 1] = puVar7;
    uVar19 = 0;
    memset(puVar5,0,__n);
    if (local_2158 == 0) {
      uVar12 = 0;
    }
    else {
      uVar12 = 0;
      uVar15 = 0;
      do {
        uVar1 = uVar15 + 1;
        uVar13 = uVar11;
        if (uVar1 < local_2158) {
          uVar13 = (ulong)puVar6[uVar1];
        }
        uVar10 = puVar6[uVar15];
        uVar18 = (ulong)uVar10;
        uVar21 = (int)uVar19 + 0x11;
        fVar26 = 0.0;
        uVar15 = uVar13 - uVar18;
        if (uVar18 <= uVar13 && uVar15 != 0) {
          puVar9 = __dest + uVar18 * 3 + 2;
          uVar17 = 0;
          uVar19 = uVar15;
          do {
            uVar23 = puVar9[-1];
            uVar3 = *puVar9;
            bVar25 = 0x10 < uVar21 - puVar5[puVar9[-2]];
            if (bVar25) {
              puVar5[puVar9[-2]] = uVar21;
              uVar21 = uVar21 + 1;
            }
            uVar4 = (uint)bVar25;
            if (0x10 < uVar21 - puVar5[uVar23]) {
              puVar5[uVar23] = uVar21;
              uVar21 = uVar21 + 1;
              uVar4 = uVar4 + 1;
            }
            if (0x10 < uVar21 - puVar5[uVar3]) {
              puVar5[uVar3] = uVar21;
              uVar21 = uVar21 + 1;
              uVar4 = uVar4 + 1;
            }
            uVar17 = uVar17 + uVar4;
            puVar9 = puVar9 + 3;
            uVar19 = uVar19 - 1;
          } while (uVar19 != 0);
          fVar26 = (float)uVar17;
        }
        lVar16 = uVar12 + 1;
        uVar19 = (ulong)(uVar21 + 0x11);
        puVar7[uVar12] = uVar10;
        if (uVar18 < uVar13) {
          puVar9 = __dest + uVar18 * 3 + 2;
          uVar17 = 0;
          uVar21 = 0;
          do {
            uVar23 = puVar9[-1];
            uVar3 = *puVar9;
            uVar4 = (uint)uVar19;
            bVar25 = 0x10 < uVar4 - puVar5[puVar9[-2]];
            if (bVar25) {
              puVar5[puVar9[-2]] = uVar4;
              uVar19 = (ulong)(uVar4 + 1);
            }
            uVar4 = (uint)bVar25;
            uVar22 = (uint)uVar19;
            if (0x10 < uVar22 - puVar5[uVar23]) {
              puVar5[uVar23] = uVar22;
              uVar19 = (ulong)(uVar22 + 1);
              uVar4 = uVar4 + 1;
            }
            uVar23 = (uint)uVar19;
            if (0x10 < uVar23 - puVar5[uVar3]) {
              puVar5[uVar3] = uVar23;
              uVar19 = (ulong)(uVar23 + 1);
              uVar4 = uVar4 + 1;
            }
            uVar21 = uVar4 + uVar21;
            uVar17 = uVar17 + 1;
            if ((float)uVar21 / (float)uVar17 <= (fVar26 / (float)uVar15) * threshold) {
              puVar7[lVar16] = (int)uVar18 + 1;
              lVar16 = lVar16 + 1;
              uVar19 = (ulong)((int)uVar19 + 0x11);
              uVar21 = 0;
              uVar17 = 0;
            }
            uVar18 = uVar18 + 1;
            puVar9 = puVar9 + 3;
          } while (uVar13 != uVar18);
        }
        uVar12 = lVar16 - (ulong)(puVar7[lVar16 + -1] != uVar10);
        uVar15 = uVar1;
      } while (uVar1 != local_2158);
      uVar19 = 0xffffffffffffffff;
      if (uVar12 < 0x4000000000000000) {
        uVar19 = uVar12 * 4;
      }
    }
    puVar5 = (uint *)(*meshopt_Allocator::StorageT<void>::allocate)(uVar19);
    local_2040 = local_2170 + 4;
    local_20f8[local_2170 + 2] = puVar5;
    uVar11 = vertex_positions_stride >> 2;
    fVar26 = 0.0;
    fVar27 = 0.0;
    fVar28 = 0.0;
    sVar8 = 0;
    do {
      fVar28 = fVar28 + vertex_positions[__dest[sVar8] * uVar11];
      fVar26 = fVar26 + (float)*(undefined8 *)(vertex_positions + __dest[sVar8] * uVar11 + 1);
      fVar27 = fVar27 + (float)((ulong)*(undefined8 *)
                                        (vertex_positions + __dest[sVar8] * uVar11 + 1) >> 0x20);
      sVar8 = sVar8 + 1;
    } while (index_count != sVar8);
    fVar31 = (float)index_count;
    if (uVar12 != 0) {
      uVar15 = 0;
      do {
        uVar1 = uVar15 + 1;
        sVar8 = index_count;
        if (uVar1 < uVar12) {
          sVar8 = (size_t)(puVar7[uVar1] * 3);
        }
        uVar13 = (ulong)(puVar7[uVar15] * 3);
        fVar37 = 0.0;
        fVar38 = 0.0;
        if (uVar13 < sVar8) {
          fVar43 = 0.0;
          fVar40 = 0.0;
          fVar39 = 0.0;
          fVar42 = 0.0;
          fVar41 = 0.0;
          do {
            fVar45 = vertex_positions[__dest[uVar13] * uVar11 + 2];
            fVar46 = vertex_positions[__dest[uVar13 + 1] * uVar11 + 2] - fVar45;
            fVar32 = (float)*(undefined8 *)(vertex_positions + __dest[uVar13 + 1] * uVar11);
            fVar33 = (float)((ulong)*(undefined8 *)(vertex_positions + __dest[uVar13 + 1] * uVar11)
                            >> 0x20);
            fVar51 = vertex_positions[__dest[uVar13 + 2] * uVar11 + 2] - fVar45;
            fVar35 = (float)*(undefined8 *)(vertex_positions + __dest[uVar13] * uVar11);
            fVar29 = fVar32 - fVar35;
            fVar36 = (float)((ulong)*(undefined8 *)(vertex_positions + __dest[uVar13] * uVar11) >>
                            0x20);
            fVar30 = fVar33 - fVar36;
            fVar47 = (float)*(undefined8 *)(vertex_positions + __dest[uVar13 + 2] * uVar11);
            fVar49 = (float)((ulong)*(undefined8 *)(vertex_positions + __dest[uVar13 + 2] * uVar11)
                            >> 0x20);
            fVar48 = fVar47 - fVar35;
            fVar50 = fVar49 - fVar36;
            fVar34 = fVar30 * fVar51 - fVar50 * fVar46;
            fVar46 = fVar46 * fVar48 - fVar51 * fVar29;
            fVar29 = fVar50 * fVar29 - fVar48 * fVar30;
            fVar42 = fVar42 + fVar46;
            fVar39 = fVar39 + fVar34;
            fVar41 = fVar41 + fVar29;
            fVar29 = SQRT(fVar29 * fVar29 + fVar34 * fVar34 + fVar46 * fVar46);
            fVar43 = fVar43 + fVar29;
            fVar29 = fVar29 / 3.0;
            fVar37 = fVar37 + fVar29 * (fVar32 + fVar35 + fVar47);
            fVar38 = fVar38 + fVar29 * (fVar33 + fVar36 + fVar49);
            fVar40 = fVar40 + (vertex_positions[__dest[uVar13 + 1] * uVar11 + 2] + fVar45 +
                              vertex_positions[__dest[uVar13 + 2] * uVar11 + 2]) * fVar29;
            uVar13 = uVar13 + 3;
          } while (uVar13 < sVar8);
        }
        else {
          fVar41 = 0.0;
          fVar42 = 0.0;
          fVar39 = 0.0;
          fVar40 = 0.0;
          fVar43 = 0.0;
        }
        fVar45 = SQRT(fVar41 * fVar41 + fVar39 * fVar39 + fVar42 * fVar42);
        auVar44._4_4_ = fVar43;
        auVar44._0_4_ = fVar45;
        auVar44._8_8_ = 0;
        auVar44 = divps(_DAT_00245cd0,auVar44);
        fVar45 = (float)(-(uint)(fVar45 != 0.0) & auVar44._0_4_);
        fVar43 = (float)(-(uint)(fVar43 != 0.0) & auVar44._4_4_);
        puVar5[uVar15] =
             (uint)((fVar38 * fVar43 - fVar26 / fVar31) * fVar42 * fVar45 +
                    fVar39 * fVar45 * (fVar37 * fVar43 - fVar28 / fVar31) +
                   fVar45 * fVar41 * (fVar40 * fVar43 - fVar27 / fVar31));
        uVar15 = uVar1;
      } while (uVar1 != uVar12);
    }
    sVar8 = 0xffffffffffffffff;
    if (-1 < (long)uVar12) {
      sVar8 = uVar12 * 2;
    }
    puVar6 = (uint *)(*meshopt_Allocator::StorageT<void>::allocate)(sVar8);
    local_2040 = local_2170 + 5;
    local_20f8[local_2170 + 3] = puVar6;
    puVar9 = (uint *)(*meshopt_Allocator::StorageT<void>::allocate)(uVar19);
    local_20f8[local_2170 + 4] = puVar9;
    if (uVar12 == 0) {
      memset(local_2038,0,0x2000);
    }
    else {
      uVar11 = 0;
      fVar26 = 0.001;
      do {
        fVar27 = ABS((float)puVar5[uVar11]);
        if (ABS((float)puVar5[uVar11]) <= fVar26) {
          fVar27 = fVar26;
        }
        uVar11 = uVar11 + 1;
        fVar26 = fVar27;
      } while (uVar12 != uVar11);
      uVar11 = 0;
      do {
        fVar26 = ((float)puVar5[uVar11] / fVar27) * -0.5 + 0.5;
        fVar26 = (float)(-(uint)(0.0 <= fVar26) & (uint)fVar26);
        if (1.0 <= fVar26) {
          fVar26 = 1.0;
        }
        *(ushort *)((long)puVar6 + uVar11 * 2) = (ushort)(int)(fVar26 * 2047.0 + 0.5) & 0x7ff;
        uVar11 = uVar11 + 1;
      } while (uVar12 != uVar11);
      uVar11 = 0;
      memset(local_2038,0,0x2000);
      do {
        local_2038[*(ushort *)((long)puVar6 + uVar11 * 2)] =
             local_2038[*(ushort *)((long)puVar6 + uVar11 * 2)] + 1;
        uVar11 = uVar11 + 1;
      } while (uVar12 != uVar11);
    }
    local_2170 = local_2170 | 6;
    lVar16 = 0;
    uVar10 = 0;
    do {
      uVar21 = local_2038[lVar16];
      local_2038[lVar16] = uVar10;
      lVar16 = lVar16 + 1;
      uVar10 = uVar21 + uVar10;
    } while (lVar16 != 0x800);
    if (uVar12 != 0) {
      uVar11 = 0;
      do {
        uVar2 = *(ushort *)((long)puVar6 + uVar11 * 2);
        uVar10 = local_2038[uVar2];
        local_2038[uVar2] = uVar10 + 1;
        puVar9[uVar10] = (uint)uVar11;
        uVar11 = uVar11 + 1;
      } while (uVar12 != uVar11);
      uVar11 = 0;
      lVar16 = 0;
      do {
        uVar19 = (ulong)(puVar9[uVar11] + 1);
        sVar8 = index_count;
        if (uVar19 < uVar12) {
          sVar8 = (size_t)(puVar7[uVar19] * 3);
        }
        lVar20 = sVar8 - puVar7[puVar9[uVar11]] * 3;
        memcpy(destination + lVar16,__dest + puVar7[puVar9[uVar11]] * 3,lVar20 * 4);
        lVar16 = lVar16 + lVar20;
        uVar11 = uVar11 + 1;
      } while (uVar12 != uVar11);
    }
  }
  while (local_2170 != 0) {
    (*meshopt_Allocator::StorageT<void>::deallocate)(local_20f8[local_2170 - 2]);
    local_2170 = local_2170 - 1;
  }
  return;
}

Assistant:

void meshopt_optimizeOverdraw(unsigned int* destination, const unsigned int* indices, size_t index_count, const float* vertex_positions, size_t vertex_count, size_t vertex_positions_stride, float threshold)
{
	using namespace meshopt;

	assert(index_count % 3 == 0);
	assert(vertex_positions_stride > 0 && vertex_positions_stride <= 256);
	assert(vertex_positions_stride % sizeof(float) == 0);

	meshopt_Allocator allocator;

	// guard for empty meshes
	if (index_count == 0 || vertex_count == 0)
		return;

	// support in-place optimization
	if (destination == indices)
	{
		unsigned int* indices_copy = allocator.allocate<unsigned int>(index_count);
		memcpy(indices_copy, indices, index_count * sizeof(unsigned int));
		indices = indices_copy;
	}

	unsigned int cache_size = 16;

	unsigned int* cache_timestamps = allocator.allocate<unsigned int>(vertex_count);

	// generate hard boundaries from full-triangle cache misses
	unsigned int* hard_clusters = allocator.allocate<unsigned int>(index_count / 3);
	size_t hard_cluster_count = generateHardBoundaries(hard_clusters, indices, index_count, vertex_count, cache_size, cache_timestamps);

	// generate soft boundaries
	unsigned int* soft_clusters = allocator.allocate<unsigned int>(index_count / 3 + 1);
	size_t soft_cluster_count = generateSoftBoundaries(soft_clusters, indices, index_count, vertex_count, hard_clusters, hard_cluster_count, cache_size, threshold, cache_timestamps);

	const unsigned int* clusters = soft_clusters;
	size_t cluster_count = soft_cluster_count;

	// fill sort data
	float* sort_data = allocator.allocate<float>(cluster_count);
	calculateSortData(sort_data, indices, index_count, vertex_positions, vertex_positions_stride, clusters, cluster_count);

	// sort clusters using sort data
	unsigned short* sort_keys = allocator.allocate<unsigned short>(cluster_count);
	unsigned int* sort_order = allocator.allocate<unsigned int>(cluster_count);
	calculateSortOrderRadix(sort_order, sort_data, sort_keys, cluster_count);

	// fill output buffer
	size_t offset = 0;

	for (size_t it = 0; it < cluster_count; ++it)
	{
		unsigned int cluster = sort_order[it];
		assert(cluster < cluster_count);

		size_t cluster_begin = clusters[cluster] * 3;
		size_t cluster_end = (cluster + 1 < cluster_count) ? clusters[cluster + 1] * 3 : index_count;
		assert(cluster_begin < cluster_end);

		memcpy(destination + offset, indices + cluster_begin, (cluster_end - cluster_begin) * sizeof(unsigned int));
		offset += cluster_end - cluster_begin;
	}

	assert(offset == index_count);
}